

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall Pathie::Path::fnmatch(Path *this,char *__pattern,char *__name,int __flags)

{
  int iVar1;
  char *__pattern_00;
  char *__name_00;
  undefined8 uVar2;
  Pathie local_60 [8];
  string pattern_nstr;
  undefined1 local_40 [8];
  string nstr;
  int flags_local;
  string *pattern_local;
  Path *this_local;
  
  native_abi_cxx11_((Path *)local_40);
  utf8_to_filename(local_60,(string *)__pattern);
  __pattern_00 = (char *)std::__cxx11::string::c_str();
  __name_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::fnmatch(__pattern_00,__name_00,(int)__name);
  std::__cxx11::string::~string((string *)local_60);
  uVar2 = std::__cxx11::string::~string((string *)local_40);
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),iVar1 == 0);
}

Assistant:

bool Path::fnmatch(const std::string& pattern, int flags /* = 0 */) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string pattern_nstr = utf8_to_filename(pattern);
  return ::fnmatch(pattern_nstr.c_str(), nstr.c_str(), flags) == 0;
#elif defined(_WIN32)
  std::wstring utf16path = utf8_to_utf16(m_path);
  std::wstring utf16pattern = utf8_to_utf16(pattern);
  return PathMatchSpecW(utf16path.c_str(), utf16pattern.c_str());
#else
#error Unsupported system.
#endif
}